

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_psbt.cpp
# Opt level: O2

FundPsbtResponseStruct *
cfd::js::api::PsbtStructApi::FundPsbt
          (FundPsbtResponseStruct *__return_storage_ptr__,FundPsbtRequestStruct *request)

{
  string *in_R8;
  allocator local_159;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  function<cfd::js::api::FundPsbtResponseStruct_(const_cfd::js::api::FundPsbtRequestStruct_&)>
  local_138;
  FundPsbtResponseStruct local_118;
  
  FundPsbtResponseStruct::FundPsbtResponseStruct(__return_storage_ptr__);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = std::
              _Function_handler<cfd::js::api::FundPsbtResponseStruct_(const_cfd::js::api::FundPsbtRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_psbt.cpp:1104:20)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<cfd::js::api::FundPsbtResponseStruct_(const_cfd::js::api::FundPsbtRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_psbt.cpp:1104:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_138,"FundPsbt",&local_159);
  ExecuteStructApi<cfd::js::api::FundPsbtRequestStruct,cfd::js::api::FundPsbtResponseStruct>
            (&local_118,(api *)request,(FundPsbtRequestStruct *)&local_158,&local_138,in_R8);
  FundPsbtResponseStruct::operator=(__return_storage_ptr__,&local_118);
  FundPsbtResponseStruct::~FundPsbtResponseStruct(&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  return __return_storage_ptr__;
}

Assistant:

FundPsbtResponseStruct PsbtStructApi::FundPsbt(
    const FundPsbtRequestStruct& request) {
  auto call_func = [](const FundPsbtRequestStruct& request)
      -> FundPsbtResponseStruct {  // NOLINT
    Psbt psbt;
    GetPsbtFromString(request.psbt, "FundPsbt", &psbt);

    std::vector<UtxoData> utxos;
    for (auto& utxo : request.utxos) {
      UtxoData data = {};
      data.address_type = AddressType::kP2shAddress;
      data.block_height = 0;
      data.binary_data = nullptr;

      data.txid = Txid(utxo.txid);
      data.vout = utxo.vout;
      data.amount = Amount::CreateBySatoshiAmount(utxo.amount);
      data.descriptor = utxo.descriptor;
      auto desc = Descriptor::Parse(data.descriptor);
      if (!utxo.script_sig_template.empty()) {
        data.scriptsig_template = Script(utxo.script_sig_template);
      }
      utxos.push_back(data);
    }

    const FundFeeInformationStruct& fee_info = request.fee_info;
    CoinSelectionOption option;
    option.InitializeTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_info.fee_rate);
    option.SetLongTermFeeBaserate(fee_info.long_term_fee_rate);
    option.SetKnapsackMinimumChange(fee_info.knapsack_min_change);
    option.SetDustFeeRate(fee_info.dust_fee_rate);

    auto change_address = Descriptor::Parse(request.reserved_descriptor);
    NetType net_type = AddressStructApi::ConvertNetType(request.network);
    Amount fee;
    uint32_t past_txout_count = psbt.GetTxOutCount();

    psbt.FundTransaction(
        utxos, fee_info.fee_rate, &change_address, &fee, &option);

    FundPsbtResponseStruct response;
    response.psbt = psbt.GetBase64();
    response.hex = psbt.GetData().GetHex();
    response.fee_amount = fee.GetSatoshiValue();
    if (past_txout_count != psbt.GetTxOutCount()) {
      auto ref = change_address.GetReference();
      if (ref.HasAddress()) {
        auto addr = ref.GenerateAddress(net_type);
        response.used_addresses.emplace_back(addr.GetAddress());
      }
    }
    return response;
  };

  FundPsbtResponseStruct result;
  result = ExecuteStructApi<FundPsbtRequestStruct, FundPsbtResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}